

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O3

float __thiscall
Rml::ElementAnimation::GetInterpolationFactorAndKeys
          (ElementAnimation *this,int *out_key0,int *out_key1)

{
  code *pcVar1;
  bool bVar2;
  pointer pAVar3;
  uint uVar4;
  int iVar5;
  pointer pAVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  
  fVar9 = this->time_since_iteration_start;
  if (this->reverse_direction != false) {
    fVar9 = this->duration - fVar9;
  }
  pAVar3 = (this->keys).super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (int)((long)(this->keys).
                      super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pAVar3 >> 3) * -0x3b13b13b;
  if (0 < (int)uVar4) {
    uVar8 = 0;
    pAVar6 = pAVar3;
    do {
      if (fVar9 <= pAVar6->time) goto LAB_002213a9;
      uVar8 = uVar8 + 1;
      pAVar6 = pAVar6 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar8);
  }
  uVar8 = (ulong)(uVar4 - 1);
LAB_002213a9:
  uVar7 = (uint)uVar8;
  iVar5 = uVar7 - 1;
  if (uVar7 == 0) {
    iVar5 = 0;
  }
  if ((((iVar5 < 0) || (uVar4 <= uVar7)) || ((int)uVar7 < 0)) || ((int)uVar4 <= iVar5)) {
    bVar2 = Assert("RMLUI_ASSERT(key0 >= 0 && key0 < (int)keys.size() && key1 >= 0 && key1 < (int)keys.size())"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementAnimation.cpp"
                   ,0x2e3);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pAVar3 = (this->keys).super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  fVar10 = pAVar3[(int)uVar7].time - pAVar3[iVar5].time;
  fVar10 = (float)(-(uint)(0.001 < fVar10) & (uint)((fVar9 - pAVar3[iVar5].time) / fVar10));
  fVar9 = 1.0;
  if (fVar10 <= 1.0) {
    fVar9 = fVar10;
  }
  fVar9 = Tween::operator()(&pAVar3[(int)uVar7].tween,(float)(~-(uint)(fVar10 < 0.0) & (uint)fVar9))
  ;
  if (out_key0 != (int *)0x0) {
    *out_key0 = iVar5;
  }
  if (out_key1 != (int *)0x0) {
    *out_key1 = uVar7;
  }
  return fVar9;
}

Assistant:

float ElementAnimation::GetInterpolationFactorAndKeys(int* out_key0, int* out_key1) const
{
	float t = time_since_iteration_start;

	if (reverse_direction)
		t = duration - t;

	int key0 = -1;
	int key1 = -1;

	{
		for (int i = 0; i < (int)keys.size(); i++)
		{
			if (keys[i].time >= t)
			{
				key1 = i;
				break;
			}
		}

		if (key1 < 0)
			key1 = (int)keys.size() - 1;
		key0 = (key1 == 0 ? 0 : key1 - 1);
	}

	RMLUI_ASSERT(key0 >= 0 && key0 < (int)keys.size() && key1 >= 0 && key1 < (int)keys.size());

	float alpha = 0.0f;

	{
		const float t0 = keys[key0].time;
		const float t1 = keys[key1].time;

		const float eps = 1e-3f;

		if (t1 - t0 > eps)
			alpha = (t - t0) / (t1 - t0);

		alpha = Math::Clamp(alpha, 0.0f, 1.0f);
	}

	alpha = keys[key1].tween(alpha);

	if (out_key0)
		*out_key0 = key0;
	if (out_key1)
		*out_key1 = key1;

	return alpha;
}